

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_2,_4> * tcu::operator*(Matrix<float,_2,_3> *a,Matrix<float,_3,_4> *b)

{
  bool bVar1;
  bool bVar2;
  Matrix<float,_2,_4> *res;
  Matrix<float,_2,_4> *in_RDI;
  long lVar3;
  long lVar4;
  Vector<float,_3> *pVVar5;
  int ndx;
  long lVar6;
  float v;
  float fVar7;
  
  *(undefined8 *)(in_RDI->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(in_RDI->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(in_RDI->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(in_RDI->m_data).m_data[1].m_data = 0;
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar4 = 0;
    do {
      fVar7 = 1.0;
      if (lVar3 != lVar4) {
        fVar7 = 0.0;
      }
      (in_RDI->m_data).m_data[lVar4].m_data[lVar3] = fVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar4 = 0;
    pVVar5 = (Vector<float,_3> *)b;
    do {
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + (a->m_data).m_data[lVar6].m_data[lVar3] *
                        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar5->m_data)->m_data[0].m_data
                        [lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      (in_RDI->m_data).m_data[lVar4].m_data[lVar3] = fVar7;
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 4);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}